

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O0

void template_load(void)

{
  Fl_Browser *this;
  int iVar1;
  int iVar2;
  char *pcVar3;
  dirent **ppdStack_c28;
  int num_files;
  dirent **files;
  char *ptr;
  char path [1024];
  char filename [1024];
  char name [1024];
  int local_c;
  int i;
  
  Fl_Preferences::getUserdataPath(&fluid_prefs,(char *)&ptr,0x400);
  fl_strlcat((char *)&ptr,"templates",0x400);
  iVar1 = fl_filename_list((char *)&ptr,&stack0xfffffffffffff3d8,fl_numericsort);
  for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
    iVar2 = fl_filename_match(ppdStack_c28[local_c]->d_name,"*.fl");
    if (iVar2 != 0) {
      fl_strlcpy(filename + 0x3f8,ppdStack_c28[local_c]->d_name,0x400);
      pcVar3 = strstr(filename + 0x3f8,".fl");
      *pcVar3 = '\0';
      for (files = (dirent **)(filename + 0x3f8); *(char *)files != '\0';
          files = (dirent **)((long)files + 1)) {
        if (*(char *)files == '_') {
          *(undefined1 *)files = 0x20;
        }
      }
      snprintf(path + 0x3f8,0x400,"%s/%s",&ptr,ppdStack_c28[local_c]->d_name);
      this = template_browser;
      pcVar3 = strdup(path + 0x3f8);
      Fl_Browser::add(this,filename + 0x3f8,pcVar3);
    }
    free(ppdStack_c28[local_c]);
  }
  if (0 < iVar1) {
    free(ppdStack_c28);
  }
  return;
}

Assistant:

void template_load() {
  int i;
  char name[1024], filename[1024], path[1024], *ptr;
  struct dirent **files;
  int num_files;
  
  fluid_prefs.getUserdataPath(path, sizeof(path));
  strlcat(path, "templates", sizeof(path));
  
  num_files = fl_filename_list(path, &files);
  
  for (i = 0; i < num_files; i ++) {
    if (fl_filename_match(files[i]->d_name, "*.fl")) {
      // Format the name as the filename with "_" replaced with " "
      // and without the trailing ".fl"...
      strlcpy(name, files[i]->d_name, sizeof(name));
      *strstr(name, ".fl") = '\0';
  
      for (ptr = name; *ptr; ptr ++) {
        if (*ptr == '_') *ptr = ' ';
      }
  
      // Add the template to the browser...
      snprintf(filename, sizeof(filename), "%s/%s", path, files[i]->d_name);
      template_browser->add(name, strdup(filename));
    }
  
    free(files[i]);
  }
  
  if (num_files > 0) free(files);
}